

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::MessageInfo::MessageInfo
          (MessageInfo *this,string *_macroName,SourceLineInfo *_lineInfo,OfType _type)

{
  undefined4 in_ECX;
  string *in_RSI;
  SourceLineInfo *in_RDI;
  SourceLineInfo *in_stack_ffffffffffffffb8;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  SourceLineInfo::SourceLineInfo(in_RDI,in_stack_ffffffffffffffb8);
  *(undefined4 *)&in_RDI[1].line = in_ECX;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  globalCount = globalCount + 1;
  *(int *)&in_RDI[2].line = globalCount;
  return;
}

Assistant:

MessageInfo::MessageInfo(   std::string const& _macroName,
                                SourceLineInfo const& _lineInfo,
                                ResultWas::OfType _type )
    :   macroName( _macroName ),
        lineInfo( _lineInfo ),
        type( _type ),
        sequence( ++globalCount )
    {}